

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O3

void __thiscall MPL::detail::ModelPackageImpl::validate(ModelPackageImpl *this)

{
  JsonMap *this_00;
  char *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  istream *piVar6;
  int *piVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long lVar9;
  long lVar10;
  runtime_error *prVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  pointer __rhs;
  uint uVar15;
  string token;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntries;
  string versionString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  versionTokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  identifiers;
  istringstream versionStringStream;
  path local_2b8;
  undefined1 local_290 [72];
  path local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  _Head_base<0UL,_JsonMap_*,_false> local_218;
  undefined1 local_210 [8];
  string local_208;
  undefined1 local_1e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  this_00 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
            _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
            super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
  local_218._M_head_impl = (JsonMap *)this;
  local_1b0._M_allocated_capacity = (size_type)local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"fileFormatVersion","");
  JsonMap::getString((string *)(local_210 + 8),this_00,(string *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_allocated_capacity != local_1a0) {
    operator_delete((void *)local_1b0._M_allocated_capacity,local_1a0[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::istringstream::istringstream
            ((istringstream *)local_1b0._M_local_buf,(string *)(local_210 + 8),_S_in);
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8._8_8_ = 0;
  local_1e8._16_8_ = 0;
  local_2b8._M_pathname._M_dataplus._M_p = (pointer)&local_2b8._M_pathname.field_2;
  local_2b8._M_pathname._M_string_length = 0;
  local_2b8._M_pathname.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0._M_local_buf,(string *)&local_2b8,'.');
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_210 + 0x28),&local_2b8._M_pathname);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_pathname._M_dataplus._M_p != &local_2b8._M_pathname.field_2) {
    operator_delete(local_2b8._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_2b8._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_2b8._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  if (local_1e8._8_8_ - local_1e8._0_8_ != 0x60) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_2b8._M_pathname,
                   "File format version must be in the form of major.minor.patch, but the specified value was: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_210 + 8));
    std::runtime_error::runtime_error(prVar11,(string *)&local_2b8);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = *(char **)local_1e8._0_8_;
  piVar7 = __errno_location();
  iVar13 = *piVar7;
  *piVar7 = 0;
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           strtol(pcVar1,(char **)&local_2b8,10);
  if (local_2b8._M_pathname._M_dataplus._M_p == pcVar1) {
    std::__throw_invalid_argument("stoi");
LAB_0011f785:
    std::__throw_out_of_range("stoi");
LAB_0011f791:
    std::__throw_invalid_argument("stoi");
LAB_0011f79d:
    std::__throw_out_of_range("stoi");
LAB_0011f7a9:
    std::__throw_invalid_argument("stoi");
  }
  else {
    if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)(int)pbVar8 !=
         pbVar8) || (iVar14 = *piVar7, iVar14 == 0x22)) goto LAB_0011f785;
    if (iVar14 == 0) {
      *piVar7 = iVar13;
      iVar14 = iVar13;
    }
    pcVar1 = *(char **)(local_1e8._0_8_ + 0x20);
    *piVar7 = 0;
    local_220 = pbVar8;
    lVar9 = strtol(pcVar1,(char **)&local_2b8,10);
    if (local_2b8._M_pathname._M_dataplus._M_p == pcVar1) goto LAB_0011f791;
    if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (iVar13 = *piVar7, iVar13 == 0x22))
    goto LAB_0011f79d;
    if (iVar13 == 0) {
      *piVar7 = iVar14;
      iVar13 = iVar14;
    }
    pcVar1 = *(char **)(local_1e8._0_8_ + 0x40);
    *piVar7 = 0;
    lVar10 = strtol(pcVar1,(char **)&local_2b8,10);
    if (local_2b8._M_pathname._M_dataplus._M_p == pcVar1) goto LAB_0011f7a9;
    if ((0xfffffffeffffffff < lVar10 - 0x80000000U) && (*piVar7 != 0x22)) {
      if (*piVar7 == 0) {
        *piVar7 = iVar13;
      }
      uVar15 = (uint)lVar9;
      uVar12 = (uint)local_220;
      if (-1 < (int)(uVar15 | uVar12 | (uint)lVar10)) {
        if (((1 < (int)uVar12) || ((uVar12 == 1 && (0 < (int)uVar15)))) ||
           ((uVar15 == 0 && (0 < (int)(uint)lVar10)))) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_2b8._M_pathname,"Unsupported version: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_210 + 8));
          std::runtime_error::runtime_error(prVar11,(string *)&local_2b8);
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        getItemInfoEntries((ModelPackageImpl *)local_210);
        if (local_210 != (undefined1  [8])0x0) {
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          JsonMap::getKeys((JsonMap *)local_210,&local_1c8);
          local_220 = local_1c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          if (local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_1e8._24_8_ = (long)local_218._M_head_impl + 0x50;
            __rhs = local_1c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
            do {
              getItemInfoEntry((ModelPackageImpl *)local_290,(string *)local_218._M_head_impl);
              uVar2 = local_290._0_8_;
              local_2b8._M_pathname._M_dataplus._M_p = (pointer)&local_2b8._M_pathname.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"path","");
              bVar3 = JsonMap::hasKey((JsonMap *)uVar2,&local_2b8._M_pathname);
              uVar2 = local_290._0_8_;
              bVar4 = true;
              if (bVar3) {
                local_248._M_pathname._M_dataplus._M_p = (pointer)&local_248._M_pathname.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"name","");
                bVar3 = JsonMap::hasKey((JsonMap *)uVar2,&local_248._M_pathname);
                uVar2 = local_290._0_8_;
                bVar4 = true;
                if (bVar3) {
                  local_290._8_8_ = local_290 + 0x18;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_290 + 8),"author","");
                  bVar3 = JsonMap::hasKey((JsonMap *)uVar2,(string *)(local_290 + 8));
                  uVar2 = local_290._0_8_;
                  bVar4 = true;
                  if (bVar3) {
                    local_290._40_8_ = local_290 + 0x38;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_290 + 0x28),"description","");
                    bVar4 = JsonMap::hasKey((JsonMap *)uVar2,(string *)(local_290 + 0x28));
                    if ((undefined1 *)local_290._40_8_ != local_290 + 0x38) {
                      operator_delete((void *)local_290._40_8_,local_290._56_8_ + 1);
                    }
                    bVar4 = !bVar4;
                  }
                  if ((undefined1 *)local_290._8_8_ != local_290 + 0x18) {
                    operator_delete((void *)local_290._8_8_,local_290._24_8_ + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_pathname._M_dataplus._M_p != &local_248._M_pathname.field_2) {
                  operator_delete(local_248._M_pathname._M_dataplus._M_p,
                                  local_248._M_pathname.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_pathname._M_dataplus._M_p != &local_2b8._M_pathname.field_2) {
                operator_delete(local_2b8._M_pathname._M_dataplus._M_p,
                                CONCAT71(local_2b8._M_pathname.field_2._M_allocated_capacity._1_7_,
                                         local_2b8._M_pathname.field_2._M_local_buf[0]) + 1);
              }
              uVar2 = local_290._0_8_;
              if (bVar4) {
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_2b8._M_pathname,"Invalid itemInfo for identifier: ",__rhs);
                std::runtime_error::runtime_error(prVar11,(string *)&local_2b8);
                __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              local_290._40_8_ = local_290 + 0x38;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(local_290 + 0x28),"path","");
              JsonMap::getString((string *)(local_290 + 8),(JsonMap *)uVar2,
                                 (string *)(local_290 + 0x28));
              std::filesystem::__cxx11::path::path(&local_248,(string *)(local_290 + 8),auto_format)
              ;
              std::filesystem::__cxx11::operator/(&local_2b8,(path *)local_1e8._24_8_,&local_248);
              std::filesystem::__cxx11::path::~path(&local_248);
              if ((undefined1 *)local_290._8_8_ != local_290 + 0x18) {
                operator_delete((void *)local_290._8_8_,local_290._24_8_ + 1);
              }
              if ((undefined1 *)local_290._40_8_ != local_290 + 0x38) {
                operator_delete((void *)local_290._40_8_,local_290._56_8_ + 1);
              }
              cVar5 = std::filesystem::status(&local_2b8);
              if ((cVar5 == -1) || (cVar5 == '\0')) {
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_248._M_pathname,"Item does not exist for identifier: ",__rhs);
                std::runtime_error::runtime_error(prVar11,(string *)&local_248);
                __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              std::filesystem::__cxx11::path::~path(&local_2b8);
              std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
                        ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_290);
              __rhs = __rhs + 1;
            } while (__rhs != local_220);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1c8);
        }
        std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
                  ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_210);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_210 + 0x28));
        std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0._M_local_buf);
        std::ios_base::~ios_base(local_138);
        if (local_208._M_dataplus._M_p != local_210 + 0x18) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      goto LAB_0011f7c1;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0011f7c1:
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_2b8._M_pathname,"File format version uses negative number(s): ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_210 + 8));
  std::runtime_error::runtime_error(prVar11,(string *)&local_2b8);
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ModelPackageImpl::validate()
{
    const std::string versionString = m_manifest->getString(kModelPackageFileFormatVersionKey);

    std::istringstream versionStringStream(versionString);
    std::vector<std::string> versionTokens;
    for (std::string token; std::getline(versionStringStream, token, '.');) {
        versionTokens.push_back(token);
    }

    if (versionTokens.size() != 3) {
        throw std::runtime_error("File format version must be in the form of major.minor.patch, but the specified value was: " + versionString);
    }

    int majorVersion = 0;
    int minorVersion = 0;
    int patchVersion = 0;
    try {
        majorVersion = std::stoi(versionTokens[0]);
        minorVersion = std::stoi(versionTokens[1]);
        patchVersion = std::stoi(versionTokens[2]);
    } catch (std::invalid_argument& e) {
        throw std::runtime_error("Failed to parse file format version: " + versionString + " because: " + e.what());
    }

    if (majorVersion < 0 ||
        minorVersion < 0 ||
        patchVersion < 0 ) {
        throw std::runtime_error("File format version uses negative number(s): " + versionString);
    }

    if ((majorVersion > kModelPackageFileFormatMajorVersion) ||
        (majorVersion == kModelPackageFileFormatMajorVersion && minorVersion > kModelPackageFileFormatMinorVersion) ||
        (minorVersion == kModelPackageFileFormatMinorVersion && patchVersion > kModelPackageFileFormatPatchVersion)) {
        throw std::runtime_error("Unsupported version: " + versionString);
    }
    
    // Validate 1.0.0 model package
    
    auto itemInfoEntries = getItemInfoEntries();
    if (itemInfoEntries != nullptr) {
        std::vector<std::string> identifiers;
        itemInfoEntries->getKeys(identifiers);
        for (const auto& identifier : identifiers) {
            auto itemInfoEntry = getItemInfoEntry(identifier);
            
            if (false == itemInfoEntry->hasKey(kModelPackageItemInfoPathKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoNameKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoAuthorKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoDescriptionKey)) {
                throw std::runtime_error("Invalid itemInfo for identifier: " + identifier);
            }
            
            auto path = m_packageDataDirPath / itemInfoEntry->getString(kModelPackageItemInfoPathKey);
            if (false == exists(path)) {
                throw std::runtime_error("Item does not exist for identifier: " + identifier);
            }
        }
    }
}